

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::AesGcmV1::AesGcmV1(AesGcmV1 *this,AesGcmV1 *other213)

{
  long in_RSI;
  TBase *in_RDI;
  
  duckdb_apache::thrift::TBase::TBase(in_RDI);
  in_RDI->_vptr_TBase = (_func_int **)&PTR__AesGcmV1_00c023f0;
  in_RDI->_vptr_TBase = (_func_int **)&PTR__AesGcmV1_00c023f0;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::__cxx11::string::string((string *)(in_RDI + 5));
  _AesGcmV1__isset::_AesGcmV1__isset((_AesGcmV1__isset *)((long)&in_RDI[9]._vptr_TBase + 1));
  std::__cxx11::string::operator=((string *)(in_RDI + 1),(string *)(in_RSI + 8));
  std::__cxx11::string::operator=((string *)(in_RDI + 5),(string *)(in_RSI + 0x28));
  *(byte *)&in_RDI[9]._vptr_TBase = *(byte *)(in_RSI + 0x48) & 1;
  *(undefined1 *)((long)&in_RDI[9]._vptr_TBase + 1) = *(undefined1 *)(in_RSI + 0x49);
  return;
}

Assistant:

AesGcmV1::AesGcmV1(const AesGcmV1& other213) {
  aad_prefix = other213.aad_prefix;
  aad_file_unique = other213.aad_file_unique;
  supply_aad_prefix = other213.supply_aad_prefix;
  __isset = other213.__isset;
}